

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionManager.cpp
# Opt level: O2

Bend * __thiscall OpenMD::SelectionManager::nextSelectedBend(SelectionManager *this,int *i)

{
  int iVar1;
  Bend *pBVar2;
  
  iVar1 = OpenMDBitSet::nextOnBit
                    ((this->ss_).bitsets_.
                     super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                     ._M_impl.super__Vector_impl_data._M_start + 2,*i);
  *i = iVar1;
  if (iVar1 == -1) {
    pBVar2 = (Bend *)0x0;
  }
  else {
    pBVar2 = (this->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar1];
  }
  return pBVar2;
}

Assistant:

Bend* SelectionManager::nextSelectedBend(int& i) {
#ifdef IS_MPI
    ++i;
    while (i < static_cast<int>(ss_.bitsets_[BEND].size())) {
      if (ss_.bitsets_[BEND][i]) {
        // check that this processor owns this bend
        if (bends_[i] != NULL) return bends_[i];
      }
      ++i;
    }
    return NULL;
#else
    i = ss_.bitsets_[BEND].nextOnBit(i);
    return i == -1 ? NULL : bends_[i];
#endif
  }